

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,basic_string_view<wchar_t> value)

{
  ulong uVar1;
  uint uVar2;
  format_specs *specs;
  buffer<wchar_t> *pbVar3;
  size_t sVar4;
  ulong uVar5;
  wchar_t *data;
  str_writer<wchar_t> local_40;
  
  uVar5 = value.size_;
  specs = this->specs_;
  if (specs == (format_specs *)0x0) {
    pbVar3 = (this->writer_).out_.container;
    sVar4 = pbVar3->size_;
    uVar1 = sVar4 + uVar5;
    if (pbVar3->capacity_ < uVar1) {
      (**pbVar3->_vptr_buffer)(pbVar3,uVar1);
    }
    pbVar3->size_ = uVar1;
    if (uVar5 != 0) {
      memmove(pbVar3->ptr_ + sVar4,value.data_,uVar5 << 2);
    }
  }
  else {
    if ((specs->type != '\0') && (specs->type != 's')) {
      error_handler::on_error((error_handler *)this,"invalid type specifier");
    }
    uVar2 = specs->precision;
    local_40.size_ = (ulong)uVar2;
    if (uVar5 <= uVar2) {
      local_40.size_ = uVar5;
    }
    if ((int)uVar2 < 0) {
      local_40.size_ = uVar5;
    }
    local_40.s = value.data_;
    basic_writer<fmt::v6::buffer_range<wchar_t>>::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::str_writer<wchar_t>>
              ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this,specs,&local_40);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }